

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O0

bool __thiscall
ON_Matrix::BackSolve
          (ON_Matrix *this,double zero_tolerance,int pt_dim,int Bsize,int Bpt_stride,double *Bpt,
          int Xpt_stride,double *Xpt)

{
  double dVar1;
  double **ppdVar2;
  double *__dest;
  double **this_m;
  double *Xj;
  double *Xi;
  double *Bi;
  int local_50;
  int k;
  int j;
  int i;
  double mij;
  int sizeof_pt;
  int Xpt_stride_local;
  double *Bpt_local;
  int Bpt_stride_local;
  int Bsize_local;
  int pt_dim_local;
  double zero_tolerance_local;
  ON_Matrix *this_local;
  
  if (this->m_row_count < this->m_col_count) {
    this_local._7_1_ = false;
  }
  else if ((Bsize < this->m_col_count) || (this->m_row_count < Bsize)) {
    this_local._7_1_ = false;
  }
  else {
    for (k = this->m_col_count; k < Bsize; k = k + 1) {
      for (local_50 = 0; local_50 < pt_dim; local_50 = local_50 + 1) {
        if (zero_tolerance < ABS(Bpt[(long)(k * Bpt_stride) + (long)local_50])) {
          return false;
        }
      }
    }
    ppdVar2 = ThisM(this);
    if (Xpt == Bpt) {
      for (k = this->m_col_count + -2; -1 < k; k = k + -1) {
        local_50 = k;
        while (local_50 = local_50 + 1, local_50 < this->m_col_count) {
          dVar1 = ppdVar2[k][local_50];
          for (Bi._4_4_ = 0; Bi._4_4_ < pt_dim; Bi._4_4_ = Bi._4_4_ + 1) {
            Xpt[(long)(k * Xpt_stride) + (long)Bi._4_4_] =
                 -dVar1 * Xpt[(long)(local_50 * Xpt_stride) + (long)Bi._4_4_] +
                 Xpt[(long)(k * Xpt_stride) + (long)Bi._4_4_];
          }
        }
      }
    }
    else {
      memcpy(Xpt + (this->m_col_count + -1) * Xpt_stride,Bpt + (this->m_col_count + -1) * Bpt_stride
             ,(long)(pt_dim << 3));
      for (k = this->m_col_count + -2; -1 < k; k = k + -1) {
        __dest = Xpt + k * Xpt_stride;
        memcpy(__dest,Bpt + k * Bpt_stride,(long)(pt_dim << 3));
        local_50 = k;
        while (local_50 = local_50 + 1, local_50 < this->m_col_count) {
          dVar1 = ppdVar2[k][local_50];
          for (Bi._4_4_ = 0; Bi._4_4_ < pt_dim; Bi._4_4_ = Bi._4_4_ + 1) {
            __dest[Bi._4_4_] =
                 -dVar1 * Xpt[(long)(local_50 * Xpt_stride) + (long)Bi._4_4_] + __dest[Bi._4_4_];
          }
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
ON_Matrix::BackSolve( 
    double zero_tolerance,
    int pt_dim,
    int Bsize,
    int Bpt_stride,
    const double* Bpt,
    int Xpt_stride,
    double* Xpt
    ) const
{
  const int sizeof_pt = pt_dim*sizeof(double);
  double mij;
  int i, j, k;
  const double* Bi;
  double* Xi;
  double* Xj;

  if ( m_col_count > m_row_count )
    return false; // under determined

  if ( Bsize < m_col_count || Bsize > m_row_count )
    return false; // under determined

  for ( i = m_col_count; i < Bsize; i++ ) 
  {
    Bi = Bpt + i*Bpt_stride;
    for( j = 0; j < pt_dim; j++ )
    {
      if ( fabs(Bi[j]) > zero_tolerance )
        return false; // over determined
    }
  }

  // backsolve
  double const*const* this_m = ThisM();
  if ( Xpt != Bpt )
  {
    Xi = Xpt + (m_col_count-1)*Xpt_stride;
    Bi = Bpt + (m_col_count-1)*Bpt_stride;
    memcpy(Xi,Bi,sizeof_pt);
    for ( i = m_col_count-2; i >= 0; i-- ) {
      Xi = Xpt + i*Xpt_stride;
      Bi = Bpt + i*Bpt_stride;
      memcpy(Xi,Bi,sizeof_pt);
      for ( j = i+1; j < m_col_count; j++ ) {
        Xj = Xpt + j*Xpt_stride;
        mij = this_m[i][j];
        for ( k = 0; k < pt_dim; k++ )
          Xi[k] -= mij*Xj[k];
      }
    }
  }
  else {
    for ( i = m_col_count-2; i >= 0; i-- ) {
      Xi = Xpt + i*Xpt_stride;
      for ( j = i+1; j < m_col_count; j++ ) {
        Xj = Xpt + j*Xpt_stride;
        mij = this_m[i][j];
        for ( k = 0; k < pt_dim; k++ )
          Xi[k] -= mij*Xj[k];
      }
    }
  }

  return true;
}